

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O3

void pztopology::TPZPyramid::GetSideHDivDirections
               (TPZVec<int> *sides,TPZVec<int> *dir,TPZVec<int> *bilounao)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  
  (*sides->_vptr_TPZVec[3])(sides,0x3a);
  (*dir->_vptr_TPZVec[3])(dir,0x3a);
  (*bilounao->_vptr_TPZVec[3])(bilounao);
  piVar1 = sides->fStore;
  piVar2 = dir->fStore;
  piVar3 = bilounao->fStore;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)piVar1 + lVar4) = *(undefined4 *)((long)&vectorsideorderPi + lVar4);
    *(undefined4 *)((long)piVar2 + lVar4) = *(undefined4 *)((long)&direcaoksioueta + lVar4);
    *(undefined4 *)((long)piVar3 + lVar4) = *(undefined4 *)((long)&bilinearounao + lVar4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xe8);
  return;
}

Assistant:

void TPZPyramid::GetSideHDivDirections(TPZVec<int> &sides, TPZVec<int> &dir, TPZVec<int> &bilounao)
    {
        int nsides = NumSides()*3+1;
        
        sides.Resize(nsides);
        dir.Resize(nsides);
        bilounao.Resize(nsides);
        
        for (int is = 0; is<nsides; is++)
        {
            sides[is] = vectorsideorderPi[is];
            dir[is] = direcaoksioueta[is];
            bilounao[is] = bilinearounao[is];
        }
    }